

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::querySamplerState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint sampler,
               GLenum pname,QueriedState *state)

{
  bool bVar1;
  char *pcVar2;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<float[4]> local_48;
  
  if (7 < type - QUERY_SAMPLER_PARAM_INTEGER) {
    return;
  }
  switch(type) {
  case QUERY_SAMPLER_PARAM_INTEGER:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameteriv
              (gl,sampler,pname,(GLint *)(local_48.m_preguard + 1));
    pcVar2 = "glGetSamplerParameteriv";
    break;
  case QUERY_SAMPLER_PARAM_FLOAT:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameterfv(gl,sampler,pname,local_48.m_preguard + 1);
    bVar1 = checkError(result,gl,"glGetSamplerParameteriv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT;
    (state->m_v).vInt = (GLint)local_48.m_preguard[1];
    return;
  case QUERY_SAMPLER_PARAM_PURE_INTEGER:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameterIiv
              (gl,sampler,pname,(GLint *)(local_48.m_preguard + 1));
    pcVar2 = "glGetSamplerParameterIiv";
    break;
  case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameterIuiv
              (gl,sampler,pname,(GLuint *)(local_48.m_preguard + 1));
    bVar1 = checkError(result,gl,"glGetSamplerParameterIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER;
    goto LAB_007cb352;
  case QUERY_SAMPLER_PARAM_INTEGER_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameteriv(gl,sampler,pname,(GLint *)local_48.m_value);
    pcVar2 = "glGetSamplerParameteriv";
    goto LAB_007cb4a8;
  case QUERY_SAMPLER_PARAM_FLOAT_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameterfv(gl,sampler,pname,local_48.m_value);
    bVar1 = checkError(result,gl,"glGetSamplerParameteriv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float[4]>::verifyValidity(&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT_VEC4;
    goto LAB_007cb4cc;
  case QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameterIiv(gl,sampler,pname,(GLint *)local_48.m_value);
    pcVar2 = "glGetSamplerParameterIiv";
LAB_007cb4a8:
    bVar1 = checkError(result,gl,pcVar2);
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int[4]> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_INTEGER_VEC4;
LAB_007cb4cc:
    (state->m_v).vInt64 = local_48.m_value._0_8_;
    (state->m_v).vInt64Vec4[1] = local_48.m_value._8_8_;
    return;
  case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetSamplerParameterIuiv(gl,sampler,pname,(GLuint *)local_48.m_value);
    bVar1 = checkError(result,gl,"glGetSamplerParameterIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER_VEC4;
    goto LAB_007cb4cc;
  }
  bVar1 = checkError(result,gl,pcVar2);
  if (!bVar1) {
    return;
  }
  bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&local_48,result);
  if (!bVar1) {
    return;
  }
  state->m_type = DATATYPE_INTEGER;
LAB_007cb352:
  (state->m_v).vInt = (GLint)local_48.m_preguard[1];
  return;
}

Assistant:

void querySamplerState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint sampler, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_SAMPLER_PARAM_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetSamplerParameteriv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetSamplerParameterfv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetSamplerParameterIiv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLuint> value;
			gl.glGetSamplerParameterIuiv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetSamplerParameteriv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_FLOAT_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat[4]> value;
			gl.glGetSamplerParameterfv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetSamplerParameterIiv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLuint[4]> value;
			gl.glGetSamplerParameterIuiv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}